

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O1

void __thiscall booster::log::sinks::syslog::~syslog(syslog *this,int __pri,char *__fmt,...)

{
  ~syslog(this,__pri,__fmt);
  operator_delete(this);
  return;
}

Assistant:

syslog::~syslog()
		{
			if(d.get() && d->log_was_opened)
				closelog();
		}